

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathFun.cpp
# Opt level: O0

double Imath_3_2::predd(double d)

{
  bool bVar1;
  double in_XMM0_Qa;
  double dVar2;
  undefined8 local_18;
  
  bVar1 = std::isfinite(in_XMM0_Qa);
  local_18 = in_XMM0_Qa;
  if (bVar1) {
    dVar2 = std::numeric_limits<double>::infinity();
    local_18 = nextafter(in_XMM0_Qa,-dVar2);
  }
  return local_18;
}

Assistant:

double predd(double d) IMATH_NOEXCEPT
{
    return  std::isfinite(d) ?
            std::nextafter(d, -std::numeric_limits<double>::infinity()) : d;
}